

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

void __thiscall Database::changeUserAlias(Database *this,int id,string *alias)

{
  int iVar1;
  ostream *poVar2;
  DatabaseException *this_00;
  char *errorMsg;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  errorMsg = (char *)0x0;
  std::operator+(&local_38,"update user set alias = \'",alias);
  std::operator+(&local_b8,&local_38,"\' where id = ");
  std::__cxx11::to_string(&local_98,id);
  std::operator+(&error,&local_b8,&local_98);
  std::operator+(&query,&error," ;");
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  iVar1 = sqlite3_exec(this->database,query._M_dataplus._M_p,(sqlite3_callback)0x0,(void *)0x0,
                       &errorMsg);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Alias changed successfully");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&query);
    return;
  }
  std::__cxx11::string::string((string *)&error,errorMsg,(allocator *)&local_b8);
  sqlite3_free(errorMsg);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_58,"Error while changing alias: ",&error);
  DatabaseException::DatabaseException(this_00,&local_58);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

void Database::changeUserAlias(int id, std::string alias)
{
	char* errorMsg = nullptr;
	std::string query = "update user set alias = '" + alias + "' where id = " + std::to_string(id) + " ;";

	int failure = sqlite3_exec(database, query.c_str(), nullptr, nullptr, &errorMsg);

	if(failure)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while changing alias: " + error);
	}
	else
	{
		std::cout << "Alias changed successfully" << std::endl;
	}
}